

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mbedtls_mpi_self_test(int verbose)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  int *piVar5;
  bool bVar6;
  mbedtls_mpi X;
  mbedtls_mpi U;
  mbedtls_mpi N;
  mbedtls_mpi A;
  mbedtls_mpi Y;
  mbedtls_mpi V;
  mbedtls_mpi E;
  mbedtls_mpi local_d8;
  mbedtls_mpi local_c0;
  mbedtls_mpi local_a8;
  mbedtls_mpi local_90;
  mbedtls_mpi local_78;
  mbedtls_mpi local_60;
  mbedtls_mpi local_48;
  
  local_90.s = 1;
  local_90.n = 0;
  local_90.p = (mbedtls_mpi_uint *)0x0;
  local_48.s = 1;
  local_48.n = 0;
  local_48.p = (mbedtls_mpi_uint *)0x0;
  local_a8.s = 1;
  local_a8.n = 0;
  local_a8.p = (mbedtls_mpi_uint *)0x0;
  local_d8.s = 1;
  local_d8.n = 0;
  local_d8.p = (mbedtls_mpi_uint *)0x0;
  local_78.s = 1;
  local_78.n = 0;
  local_78.p = (mbedtls_mpi_uint *)0x0;
  local_c0.s = 1;
  local_c0.n = 0;
  local_c0.p = (mbedtls_mpi_uint *)0x0;
  local_60.s = 1;
  local_60.n = 0;
  local_60.p = (mbedtls_mpi_uint *)0x0;
  uVar1 = mbedtls_mpi_read_string
                    (&local_90,0x10,
                     "EFE021C2645FD1DC586E69184AF4A31ED5F53E93B5F123FA41680867BA110131944FE7952E2517337780CB0DB80E61AAE7C8DDC6C5C6AADEB34EB38A2F40D5E6"
                    );
  if (uVar1 == 0) {
    uVar1 = mbedtls_mpi_read_string
                      (&local_48,0x10,
                       "B2E7EFD37075B9F03FF989C7C5051C2034D2A323810251127E7BF8625A4F49A5F3E27F4DA8BD59C47D6DAABA4C8127BD5B5C25763222FEFCCFC38B832366C29E"
                      );
    if (uVar1 != 0) goto LAB_001148a2;
    uVar1 = mbedtls_mpi_read_string
                      (&local_a8,0x10,
                       "0066A198186C18C10B2F5ED9B522752A9830B69916E535C8F047518A889A43A594B6BED27A168D31D4A52F88925AA8F5"
                      );
    if (uVar1 != 0) goto LAB_001148a2;
    uVar1 = mbedtls_mpi_mul_mpi(&local_d8,&local_90,&local_a8);
    if (uVar1 != 0) goto LAB_001148a2;
    uVar1 = mbedtls_mpi_read_string
                      (&local_c0,0x10,
                       "602AB7ECA597A3D6B56FF9829A5E8B859E857EA95A03512E2BAE7391688D264AA5663B0341DB9CCFD2C4C5F421FEC8148001B72E848A38CAE1C65F78E56ABDEFE12D3C039B8A02D6BE593F0BBBDA56F1ECF677152EF804370C1A305CAF3B5BF130879B56C61DE584A0F53A2447A51E"
                      );
    if (uVar1 != 0) goto LAB_001148a2;
    if (verbose == 0) {
      iVar2 = mbedtls_mpi_cmp_mpi(&local_d8,&local_c0);
      if (iVar2 == 0) goto LAB_00114b00;
LAB_0011490b:
      uVar1 = 1;
      goto LAB_00114910;
    }
    printf("  MPI test #1 (mul_mpi): ");
    iVar2 = mbedtls_mpi_cmp_mpi(&local_d8,&local_c0);
    if (iVar2 == 0) {
      puts("passed");
LAB_00114b00:
      uVar1 = mbedtls_mpi_div_mpi(&local_d8,&local_78,&local_90,&local_a8);
      if (uVar1 == 0) {
        uVar1 = mbedtls_mpi_read_string(&local_c0,0x10,"256567336059E52CAE22925474705F39A94");
        if (uVar1 == 0) {
          uVar1 = mbedtls_mpi_read_string
                            (&local_60,0x10,
                             "6613F26162223DF488E9CD48CC132C7A0AC93C701B001B092E4E5B9F73BCD27B9EE50D0657C77F374E903CDFA4C642"
                            );
          if (uVar1 == 0) {
            if (verbose != 0) {
              printf("  MPI test #2 (div_mpi): ");
            }
            iVar2 = mbedtls_mpi_cmp_mpi(&local_d8,&local_c0);
            if (iVar2 == 0) {
              iVar2 = mbedtls_mpi_cmp_mpi(&local_78,&local_60);
              if (iVar2 != 0) goto LAB_00114b91;
              if (verbose != 0) {
                puts("passed");
              }
              uVar1 = mbedtls_mpi_exp_mod(&local_d8,&local_90,&local_48,&local_a8,(mbedtls_mpi *)0x0
                                         );
              if (uVar1 != 0) goto LAB_001148a2;
              uVar1 = mbedtls_mpi_read_string
                                (&local_c0,0x10,
                                 "36E139AEA55215609D2816998ED020BBBD96C37890F65171D948E9BC7CBAA4D9325D24D6A3C12710F10A09FA08AB87"
                                );
              if (uVar1 != 0) goto LAB_001148a2;
              if (verbose == 0) {
                iVar2 = mbedtls_mpi_cmp_mpi(&local_d8,&local_c0);
                if (iVar2 != 0) goto LAB_0011490b;
              }
              else {
                printf("  MPI test #3 (exp_mod): ");
                iVar2 = mbedtls_mpi_cmp_mpi(&local_d8,&local_c0);
                if (iVar2 != 0) goto LAB_001148e3;
                puts("passed");
              }
              uVar1 = mbedtls_mpi_inv_mod(&local_d8,&local_90,&local_a8);
              if (uVar1 != 0) goto LAB_001148a2;
              uVar1 = mbedtls_mpi_read_string
                                (&local_c0,0x10,
                                 "003A0AAEDD7E784FC07D8F9EC6E3BFD5C3DBA76456363A10869622EAC2DD84ECC5B8A74DAC4D09E03B5E0BE779F2DF61"
                                );
              if (uVar1 != 0) goto LAB_001148a2;
              if (verbose == 0) {
                iVar2 = mbedtls_mpi_cmp_mpi(&local_d8,&local_c0);
                if (iVar2 != 0) goto LAB_0011490b;
              }
              else {
                printf("  MPI test #4 (inv_mod): ");
                iVar2 = mbedtls_mpi_cmp_mpi(&local_d8,&local_c0);
                if (iVar2 != 0) goto LAB_001148e3;
                puts("passed");
                printf("  MPI test #5 (simple gcd): ");
              }
              piVar5 = gcd_pairs[0] + 2;
              uVar4 = 0;
              do {
                uVar1 = mbedtls_mpi_lset(&local_d8,(long)(*(int (*) [3])(piVar5 + -2))[0]);
                if (uVar1 != 0) goto LAB_001148a2;
                uVar1 = mbedtls_mpi_lset(&local_78,(long)piVar5[-1]);
                if (uVar1 != 0) goto LAB_001148a2;
                uVar1 = mbedtls_mpi_gcd(&local_90,&local_d8,&local_78);
                if (uVar1 != 0) goto LAB_001148a2;
                iVar2 = mbedtls_mpi_cmp_int(&local_90,(long)*piVar5);
                if (iVar2 != 0) {
                  if (verbose == 0) goto LAB_00114b99;
                  printf("failed at %d\n",uVar4 & 0xffffffff);
                  goto LAB_001148ef;
                }
                uVar4 = uVar4 + 1;
                piVar5 = piVar5 + 3;
              } while (uVar4 != 3);
              uVar1 = 0;
              if (verbose != 0) {
                puts("passed");
              }
            }
            else {
LAB_00114b91:
              if (verbose != 0) goto LAB_001148e3;
LAB_00114b99:
              uVar1 = 1;
            }
            bVar6 = verbose != 0;
            goto LAB_00114912;
          }
        }
      }
      goto LAB_001148a2;
    }
LAB_001148e3:
    puts("failed");
LAB_001148ef:
    uVar4 = 1;
  }
  else {
LAB_001148a2:
    uVar4 = (ulong)uVar1;
    if (verbose == 0) {
LAB_00114910:
      bVar6 = false;
      goto LAB_00114912;
    }
  }
  uVar1 = (uint)uVar4;
  printf("Unexpected error, return code = %08X\n",uVar4);
  bVar6 = true;
LAB_00114912:
  if (local_90.p != (mbedtls_mpi_uint *)0x0) {
    if (local_90.n != 0) {
      sVar3 = 0;
      do {
        local_90.p[sVar3] = 0;
        sVar3 = sVar3 + 1;
      } while (local_90.n != sVar3);
    }
    free(local_90.p);
  }
  local_90.s = 1;
  local_90.n = 0;
  local_90.p = (mbedtls_mpi_uint *)0x0;
  if (local_48.p != (mbedtls_mpi_uint *)0x0) {
    if (local_48.n != 0) {
      sVar3 = 0;
      do {
        local_48.p[sVar3] = 0;
        sVar3 = sVar3 + 1;
      } while (local_48.n != sVar3);
    }
    free(local_48.p);
  }
  local_48.s = 1;
  local_48.n = 0;
  local_48.p = (mbedtls_mpi_uint *)0x0;
  if (local_a8.p != (mbedtls_mpi_uint *)0x0) {
    if (local_a8.n != 0) {
      sVar3 = 0;
      do {
        local_a8.p[sVar3] = 0;
        sVar3 = sVar3 + 1;
      } while (local_a8.n != sVar3);
    }
    free(local_a8.p);
  }
  local_a8.s = 1;
  local_a8.n = 0;
  local_a8.p = (mbedtls_mpi_uint *)0x0;
  if (local_d8.p != (mbedtls_mpi_uint *)0x0) {
    if (local_d8.n != 0) {
      sVar3 = 0;
      do {
        local_d8.p[sVar3] = 0;
        sVar3 = sVar3 + 1;
      } while (local_d8.n != sVar3);
    }
    free(local_d8.p);
  }
  local_d8.s = 1;
  local_d8.n = 0;
  local_d8.p = (mbedtls_mpi_uint *)0x0;
  if (local_78.p != (mbedtls_mpi_uint *)0x0) {
    if (local_78.n != 0) {
      sVar3 = 0;
      do {
        local_78.p[sVar3] = 0;
        sVar3 = sVar3 + 1;
      } while (local_78.n != sVar3);
    }
    free(local_78.p);
  }
  local_78.s = 1;
  local_78.n = 0;
  local_78.p = (mbedtls_mpi_uint *)0x0;
  if (local_c0.p != (mbedtls_mpi_uint *)0x0) {
    if (local_c0.n != 0) {
      sVar3 = 0;
      do {
        local_c0.p[sVar3] = 0;
        sVar3 = sVar3 + 1;
      } while (local_c0.n != sVar3);
    }
    free(local_c0.p);
  }
  local_c0.s = 1;
  local_c0.n = 0;
  local_c0.p = (mbedtls_mpi_uint *)0x0;
  if (local_60.p != (mbedtls_mpi_uint *)0x0) {
    if (local_60.n != 0) {
      sVar3 = 0;
      do {
        local_60.p[sVar3] = 0;
        sVar3 = sVar3 + 1;
      } while (local_60.n != sVar3);
    }
    free(local_60.p);
  }
  local_60.s = 1;
  local_60.n = 0;
  local_60.p = (mbedtls_mpi_uint *)0x0;
  if (bVar6) {
    putchar(10);
  }
  return uVar1;
}

Assistant:

int mbedtls_mpi_self_test( int verbose )
{
    int ret, i;
    mbedtls_mpi A, E, N, X, Y, U, V;

    mbedtls_mpi_init( &A ); mbedtls_mpi_init( &E ); mbedtls_mpi_init( &N ); mbedtls_mpi_init( &X );
    mbedtls_mpi_init( &Y ); mbedtls_mpi_init( &U ); mbedtls_mpi_init( &V );

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &A, 16,
        "EFE021C2645FD1DC586E69184AF4A31E" \
        "D5F53E93B5F123FA41680867BA110131" \
        "944FE7952E2517337780CB0DB80E61AA" \
        "E7C8DDC6C5C6AADEB34EB38A2F40D5E6" ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &E, 16,
        "B2E7EFD37075B9F03FF989C7C5051C20" \
        "34D2A323810251127E7BF8625A4F49A5" \
        "F3E27F4DA8BD59C47D6DAABA4C8127BD" \
        "5B5C25763222FEFCCFC38B832366C29E" ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &N, 16,
        "0066A198186C18C10B2F5ED9B522752A" \
        "9830B69916E535C8F047518A889A43A5" \
        "94B6BED27A168D31D4A52F88925AA8F5" ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &X, &A, &N ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &U, 16,
        "602AB7ECA597A3D6B56FF9829A5E8B85" \
        "9E857EA95A03512E2BAE7391688D264A" \
        "A5663B0341DB9CCFD2C4C5F421FEC814" \
        "8001B72E848A38CAE1C65F78E56ABDEF" \
        "E12D3C039B8A02D6BE593F0BBBDA56F1" \
        "ECF677152EF804370C1A305CAF3B5BF1" \
        "30879B56C61DE584A0F53A2447A51E" ) );

    if( verbose != 0 )
        mbedtls_printf( "  MPI test #1 (mul_mpi): " );

    if( mbedtls_mpi_cmp_mpi( &X, &U ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        ret = 1;
        goto cleanup;
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    MBEDTLS_MPI_CHK( mbedtls_mpi_div_mpi( &X, &Y, &A, &N ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &U, 16,
        "256567336059E52CAE22925474705F39A94" ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &V, 16,
        "6613F26162223DF488E9CD48CC132C7A" \
        "0AC93C701B001B092E4E5B9F73BCD27B" \
        "9EE50D0657C77F374E903CDFA4C642" ) );

    if( verbose != 0 )
        mbedtls_printf( "  MPI test #2 (div_mpi): " );

    if( mbedtls_mpi_cmp_mpi( &X, &U ) != 0 ||
        mbedtls_mpi_cmp_mpi( &Y, &V ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        ret = 1;
        goto cleanup;
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &X, &A, &E, &N, NULL ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &U, 16,
        "36E139AEA55215609D2816998ED020BB" \
        "BD96C37890F65171D948E9BC7CBAA4D9" \
        "325D24D6A3C12710F10A09FA08AB87" ) );

    if( verbose != 0 )
        mbedtls_printf( "  MPI test #3 (exp_mod): " );

    if( mbedtls_mpi_cmp_mpi( &X, &U ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        ret = 1;
        goto cleanup;
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( &X, &A, &N ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &U, 16,
        "003A0AAEDD7E784FC07D8F9EC6E3BFD5" \
        "C3DBA76456363A10869622EAC2DD84EC" \
        "C5B8A74DAC4D09E03B5E0BE779F2DF61" ) );

    if( verbose != 0 )
        mbedtls_printf( "  MPI test #4 (inv_mod): " );

    if( mbedtls_mpi_cmp_mpi( &X, &U ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        ret = 1;
        goto cleanup;
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    if( verbose != 0 )
        mbedtls_printf( "  MPI test #5 (simple gcd): " );

    for( i = 0; i < GCD_PAIR_COUNT; i++ )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &X, gcd_pairs[i][0] ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &Y, gcd_pairs[i][1] ) );

        MBEDTLS_MPI_CHK( mbedtls_mpi_gcd( &A, &X, &Y ) );

        if( mbedtls_mpi_cmp_int( &A, gcd_pairs[i][2] ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed at %d\n", i );

            ret = 1;
            goto cleanup;
        }
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

cleanup:

    if( ret != 0 && verbose != 0 )
        mbedtls_printf( "Unexpected error, return code = %08X\n", ret );

    mbedtls_mpi_free( &A ); mbedtls_mpi_free( &E ); mbedtls_mpi_free( &N ); mbedtls_mpi_free( &X );
    mbedtls_mpi_free( &Y ); mbedtls_mpi_free( &U ); mbedtls_mpi_free( &V );

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( ret );
}